

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void C_ArchiveCVars(FConfigFile *f,uint32 filter)

{
  char *value;
  char *key;
  UCVarValue val;
  FBaseCVar *cvar;
  uint32 filter_local;
  FConfigFile *f_local;
  
  for (val.pGUID = (GUID *)CVars; val.String != (char *)0x0;
      val = *(UCVarValue *)(val.String + 0x20)) {
    if ((*(uint *)(val.String + 0x10) & 0x3507) == filter) {
      value = (char *)(**(code **)(*(long *)val.String + 0x20))(val.String,3);
      key = FBaseCVar::GetName(val.String);
      FConfigFile::SetValueForKey(f,key,value,false);
    }
  }
  return;
}

Assistant:

void C_ArchiveCVars (FConfigFile *f, uint32 filter)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		if ((cvar->Flags &
			(CVAR_GLOBALCONFIG|CVAR_ARCHIVE|CVAR_MOD|CVAR_AUTO|CVAR_USERINFO|CVAR_SERVERINFO|CVAR_NOSAVE))
			== filter)
		{
			UCVarValue val;
			val = cvar->GetGenericRep (CVAR_String);
			f->SetValueForKey (cvar->GetName (), val.String);
		}
		cvar = cvar->m_Next;
	}
}